

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::StructValues
          (StructValues<wasm::(anonymous_namespace)::FieldInfo> *this,
          StructValues<wasm::(anonymous_namespace)::FieldInfo> *param_1)

{
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *param_1_local;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_local;
  
  std::
  vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  ::vector(&this->
            super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
           ,&param_1->
             super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
          );
  return;
}

Assistant:

T& operator[](size_t index) {
    assert(index < this->size());
    return std::vector<T>::operator[](index);
  }